

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O0

long __thiscall
cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>::
fill_internal_input(cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
                    *this,float *input_buffer,long *input_frames_count,float *output_buffer,
                   long param_5)

{
  uint uVar1;
  pointer this_00;
  size_t sVar2;
  float *pfVar3;
  long lVar4;
  long *in_RDX;
  float *in_RDI;
  delay_line<float> *in_R8;
  long got;
  size_t frames_resampled;
  uint32_t resampled_frame_count;
  float *resampled_input;
  undefined8 in_stack_ffffffffffffffa0;
  uint32_t frame_count;
  delay_line<float> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t frames_needed;
  long local_8;
  
  frame_count = (uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  frames_needed = 0;
  this_00 = std::unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>::operator->
                      ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)
                       0x11af89);
  sVar2 = delay_line<float>::output_for_input(this_00,(uint32_t)*in_RDX);
  uVar1 = (uint)sVar2;
  std::unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>::operator->
            ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)0x11afad);
  delay_line<float>::input(in_stack_ffffffffffffffb0,in_RDI,frame_count);
  if (uVar1 == 0) {
    local_8 = *in_RDX;
  }
  else {
    std::unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>::operator->
              ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)0x11aff4);
    pfVar3 = delay_line<float>::output
                       (in_R8,frames_needed,(size_t *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
    *in_RDX = 0;
    lVar4 = (**(code **)(in_RDI + 0xc))
                      (*(undefined8 *)(in_RDI + 10),*(undefined8 *)(in_RDI + 0xe),pfVar3,0,uVar1);
    local_8 = *in_RDX * (lVar4 / (long)(ulong)uVar1);
  }
  return local_8;
}

Assistant:

long
cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::fill_internal_input(
    T * input_buffer, long * input_frames_count, T * output_buffer,
    long /*output_frames_needed*/)
{
  assert(input_buffer && input_frames_count && *input_frames_count &&
         !output_buffer);

  /* The input data, after eventual resampling. This is passed to the callback.
   */
  T * resampled_input = nullptr;
  uint32_t resampled_frame_count =
      input_processor->output_for_input(*input_frames_count);

  /* process the input, and present exactly `output_frames_needed` in the
   * callback. */
  input_processor->input(input_buffer, *input_frames_count);

  /* resampled_frame_count == 0 happens if the resampler
   * doesn't have enough input frames buffered to produce 1 resampled frame. */
  if (resampled_frame_count == 0) {
    return *input_frames_count;
  }

  size_t frames_resampled = 0;
  resampled_input =
      input_processor->output(resampled_frame_count, &frames_resampled);
  *input_frames_count = frames_resampled;

  long got = data_callback(stream, user_ptr, resampled_input, nullptr,
                           resampled_frame_count);

  /* Return the number of initial input frames or part of it.
   * Since output_frames_needed == 0 in input scenario, the only
   * available number outside resampler is the initial number of frames. */
  return (*input_frames_count) * (got / resampled_frame_count);
}